

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRConstantOp *cop)

{
  char (*in_R8) [2];
  string sStack_38;
  
  if (*(int *)&(cop->super_IVariant).field_0xc == 0x74) {
    add_spv_func_and_recompile(this,SPVFuncImplQuantizeToF16);
    CompilerGLSL::to_expression_abi_cxx11_
              (&sStack_38,&this->super_CompilerGLSL,
               *(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<char_const(&)[18],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)"spvQuantizeToF16(",(char (*) [18])&sStack_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,in_R8);
    ::std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    CompilerGLSL::constant_op_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,cop);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::constant_op_expression(const SPIRConstantOp &cop)
{
	switch (cop.opcode)
	{
	case OpQuantizeToF16:
		add_spv_func_and_recompile(SPVFuncImplQuantizeToF16);
		return join("spvQuantizeToF16(", to_expression(cop.arguments[0]), ")");
	default:
		return CompilerGLSL::constant_op_expression(cop);
	}
}